

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  pointer this_00;
  Arena *arena;
  UnknownFieldSet *pUVar1;
  UnknownField *field;
  int number_local;
  UnknownFieldSet *this_local;
  
  this_00 = RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_);
  this_00->number_ = number;
  UnknownField::SetType(this_00,TYPE_GROUP);
  arena = UnknownFieldSet::arena(this);
  pUVar1 = Arena::Create<google::protobuf::UnknownFieldSet>(arena);
  (this_00->data_).group = pUVar1;
  return (UnknownFieldSet *)(this_00->data_).varint;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group = Arena::Create<UnknownFieldSet>(arena());
  return field.data_.group;
}